

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

void ClassifyHelper(int a_index,int a_group,ON_RTreePartitionVars *a_parVars)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ON_RTreeBBox local_58;
  
  a_parVars->m_partition[a_index] = a_group;
  a_parVars->m_taken[a_index] = 1;
  iVar3 = a_parVars->m_count[(uint)a_group];
  if (iVar3 == 0) {
    dVar4 = a_parVars->m_branchBuf[a_index].m_rect.m_min[0];
    dVar5 = a_parVars->m_branchBuf[a_index].m_rect.m_min[1];
    pdVar1 = a_parVars->m_branchBuf[a_index].m_rect.m_min + 2;
    dVar6 = *pdVar1;
    dVar7 = pdVar1[1];
    pdVar2 = a_parVars->m_branchBuf[a_index].m_rect.m_max + 1;
    dVar8 = pdVar2[1];
    pdVar1 = a_parVars->m_cover[(uint)a_group].m_max + 1;
    *pdVar1 = *pdVar2;
    pdVar1[1] = dVar8;
    pdVar1 = a_parVars->m_cover[(uint)a_group].m_min + 2;
    *pdVar1 = dVar6;
    pdVar1[1] = dVar7;
    a_parVars->m_cover[(uint)a_group].m_min[0] = dVar4;
    a_parVars->m_cover[(uint)a_group].m_min[1] = dVar5;
  }
  else {
    CombineRectHelper(&local_58,&a_parVars->m_branchBuf[a_index].m_rect,
                      a_parVars->m_cover + (uint)a_group);
    a_parVars->m_cover[(uint)a_group].m_max[1] = local_58.m_max[1];
    a_parVars->m_cover[(uint)a_group].m_max[2] = local_58.m_max[2];
    a_parVars->m_cover[(uint)a_group].m_min[2] = local_58.m_min[2];
    a_parVars->m_cover[(uint)a_group].m_max[0] = local_58.m_max[0];
    a_parVars->m_cover[(uint)a_group].m_min[0] = local_58.m_min[0];
    a_parVars->m_cover[(uint)a_group].m_min[1] = local_58.m_min[1];
  }
  dVar4 = a_parVars->m_cover[(uint)a_group].m_max[0] - a_parVars->m_cover[(uint)a_group].m_min[0];
  dVar6 = a_parVars->m_cover[(uint)a_group].m_max[1] - a_parVars->m_cover[(uint)a_group].m_min[1];
  dVar5 = a_parVars->m_cover[(uint)a_group].m_max[2] - a_parVars->m_cover[(uint)a_group].m_min[2];
  a_parVars->m_area[(uint)a_group] = dVar5 * dVar5 + dVar6 * dVar6 + dVar4 * dVar4;
  a_parVars->m_count[(uint)a_group] = iVar3 + 1;
  return;
}

Assistant:

void ClassifyHelper(int a_index, int a_group, ON_RTreePartitionVars* a_parVars)
{
  a_parVars->m_partition[a_index] = a_group;
  a_parVars->m_taken[a_index] = true;

  if (a_parVars->m_count[a_group] == 0)
  {
    a_parVars->m_cover[a_group] = a_parVars->m_branchBuf[a_index].m_rect;
  }
  else
  {
    a_parVars->m_cover[a_group] = CombineRectHelper(&a_parVars->m_branchBuf[a_index].m_rect, &a_parVars->m_cover[a_group]);
  }
  a_parVars->m_area[a_group] = CalcRectVolumeHelper(&a_parVars->m_cover[a_group]);
  ++a_parVars->m_count[a_group];
}